

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescue.c
# Opt level: O2

int source_callback(void *data,int len,void *user)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  long lVar5;
  ulong uVar6;
  
  uVar4 = 0;
  uVar6 = (ulong)(uint)len;
  if (len < 1) {
    uVar6 = uVar4;
  }
  do {
    if (uVar4 == uVar6) {
      return 1;
    }
    uVar3 = (ulong)*(int *)((long)user + 0x18);
    cVar1 = *(char *)((long)data + uVar4);
    if ((long)uVar3 < 1) {
      if (cVar1 != **(char **)((long)user + 8)) goto LAB_001016db;
      *(undefined4 *)((long)user + 0x18) = 1;
    }
    else {
      cVar2 = (*(char **)((long)user + 8))[uVar3];
      if (cVar1 == cVar2) {
        *(int *)((long)user + 0x18) = *(int *)((long)user + 0x18) + 1;
      }
      else {
        if (cVar2 == '\0') {
          *(undefined4 *)((long)user + 0x18) = 0;
          fputs(*(char **)((long)user + 0x10),*user);
        }
        else {
          for (lVar5 = 0; lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
            fputc((int)*(char *)(*(long *)((long)user + 8) + lVar5),*user);
            uVar3 = (ulong)*(uint *)((long)user + 0x18);
          }
          *(undefined4 *)((long)user + 0x18) = 0;
        }
        cVar1 = *(char *)((long)data + uVar4);
LAB_001016db:
        fputc((int)cVar1,*user);
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int source_callback(const void* data, int len, void *user)
{
    source_data* env = (source_data*) user;
    const char* buffer = (const char*) data;
    int i = 0;

    // Copy the buffer to output and look for placeholder, replace it with data
    while (i < len)
    {
        // We are already recognizing placeholder
        if (env->state > 0) {
            if (buffer[i] == env->placeholder[env->state])
            {
                env->state++;
            } else {
                if (env->placeholder[env->state] == 0) // Placeholder recognized, insert data
                {

                    env->state = 0;

                    fprintf(env->out, "%s", env->identifier);
                    fputc(buffer[i], env->out);
                } else { // Not a placeholder, abort
                    int j;

                    for (j = 0; j < env->state; j++)
                        fputc(env->placeholder[j], env->out);

                    env->state = 0;

                    fputc(buffer[i], env->out);
                }

            }
        } else {
            if (buffer[i] == env->placeholder[0]) // Enter placeholder seek mode, pause output
            {
                env->state = 1;
            } else { // Output normally
                fputc(buffer[i], env->out);
            }
        }
        i++;
    }

    return 1;
}